

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_ObjSetdownSimInfo(Abc_Obj_t *pObj)

{
  Sfm_Dec_t *p;
  int iVar1;
  word wVar2;
  word wVar3;
  word *pwVar4;
  ulong uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  word uSims [2];
  
  p = (Sfm_Dec_t *)pObj->pNtk->pData;
  if (p->pPars->fUseSim != 0) {
    for (i = 0; i < p->nDivs; i = i + 1) {
      iVar1 = Vec_IntEntry(&p->vObjMap,i);
      wVar2 = Vec_WrdEntry(&p->vObjSims,iVar1);
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        iVar1 = p->nPats[lVar6];
        if (0x1f < iVar1) {
          iVar1 = 0x20;
        }
        wVar3 = Abc_Tt6Mask(iVar1);
        pwVar4 = Sfm_DecDivPats(p,i,(int)lVar6);
        uSims[lVar6] = (*pwVar4 ^ wVar2) & wVar3 ^ wVar2;
        wVar2 = wVar2 >> 0x20;
      }
      uVar5 = (ulong)(uint)uSims[0];
      uVar7 = uSims[1] << 0x20;
      iVar1 = Vec_IntEntry(&p->vObjMap,i);
      Vec_WrdWriteEntry(&p->vObjSims,iVar1,uVar7 | uVar5);
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetdownSimInfo( Abc_Obj_t * pObj )
{
    int nPatKeep = 32;
    Sfm_Dec_t * p = Sfm_DecMan( pObj );
    int c, d; word uSim, uSims[2], uMask;
    if ( !p->pPars->fUseSim )
        return;
    for ( d = 0; d < p->nDivs; d++ )
    {
        uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
        for ( c = 0; c < 2; c++ )
        {
            uMask = Abc_Tt6Mask( Abc_MinInt(p->nPats[c], nPatKeep) );
            uSims[c] = (Sfm_DecDivPats(p, d, c)[0] & uMask) | (uSim & ~uMask);
            uSim >>= 32;
        }
        uSim = (uSims[0] & 0xFFFFFFFF) | (uSims[1] << 32);
        Vec_WrdWriteEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d), uSim );
    }
}